

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O0

int utflen(lua_State *L)

{
  char *pcVar1;
  lua_Integer lVar2;
  char *pcVar3;
  char *s1;
  lua_Integer posj;
  lua_Integer posi;
  char *s;
  size_t len;
  lua_State *plStack_18;
  int n;
  lua_State *L_local;
  
  len._4_4_ = 0;
  plStack_18 = L;
  pcVar1 = luaL_checklstring(L,1,(size_t *)&s);
  lVar2 = luaL_optinteger(plStack_18,2,1);
  posj = u_posrelat(lVar2,(size_t)s);
  lVar2 = luaL_optinteger(plStack_18,3,-1);
  lVar2 = u_posrelat(lVar2,(size_t)s);
  if ((posj < 1) || (posj = posj + -1, (long)s < posj)) {
    luaL_argerror(plStack_18,2,"initial position out of string");
  }
  if ((long)s <= lVar2 + -1) {
    luaL_argerror(plStack_18,3,"final position out of string");
  }
  while( true ) {
    if (lVar2 + -1 < posj) {
      lua_pushinteger(plStack_18,(long)len._4_4_);
      return 1;
    }
    pcVar3 = utf8_decode(pcVar1 + posj,(int *)0x0);
    if (pcVar3 == (char *)0x0) break;
    posj = (long)pcVar3 - (long)pcVar1;
    len._4_4_ = len._4_4_ + 1;
  }
  lua_pushnil(plStack_18);
  lua_pushinteger(plStack_18,posj + 1);
  return 2;
}

Assistant:

static int utflen (lua_State *L) {
  int n = 0;
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer posi = u_posrelat(luaL_optinteger(L, 2, 1), len);
  lua_Integer posj = u_posrelat(luaL_optinteger(L, 3, -1), len);
  luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer)len, 2,
                   "initial position out of string");
  luaL_argcheck(L, --posj < (lua_Integer)len, 3,
                   "final position out of string");
  while (posi <= posj) {
    const char *s1 = utf8_decode(s + posi, NULL);
    if (s1 == NULL) {  /* conversion error? */
      lua_pushnil(L);  /* return nil ... */
      lua_pushinteger(L, posi + 1);  /* ... and current position */
      return 2;
    }
    posi = s1 - s;
    n++;
  }
  lua_pushinteger(L, n);
  return 1;
}